

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O0

int count_newlines(char *str)

{
  char *local_20;
  char *ptr;
  int count;
  char *str_local;
  
  ptr._4_4_ = 0;
  local_20 = str;
  while( true ) {
    local_20 = strchr(local_20,10);
    if (local_20 == (char *)0x0) break;
    ptr._4_4_ = ptr._4_4_ + 1;
    local_20 = local_20 + 1;
  }
  return ptr._4_4_;
}

Assistant:

static int count_newlines(const char *str) {
  int count = 0;
  const char *ptr = str;
  while ((ptr = strchr(ptr, '\n')) != NULL) {
    count++;
    ptr++;
  }
  return count;
}